

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ping-pong.cpp
# Opt level: O0

void __thiscall Wall::do_start(Wall *this,actor_ref *param_1,msg_start *msg)

{
  int iVar1;
  msg_ball local_25;
  int local_24;
  msg_start *pmStack_20;
  int i;
  msg_start *msg_local;
  actor_ref *param_1_local;
  Wall *this_local;
  
  pmStack_20 = msg;
  msg_local = (msg_start *)param_1;
  param_1_local = (actor_ref *)this;
  acto::actor_ref::operator=(&this->m_console,&msg->console);
  for (local_24 = 0; local_24 < pmStack_20->balls; local_24 = local_24 + 1) {
    iVar1 = rand();
    acto::actor_ref::send<msg_ball>(this->m_players + iVar1 % 10000,&local_25);
  }
  return;
}

Assistant:

void do_start(acto::actor_ref, const msg_start& msg) {
    m_console = msg.console;

    // Послать мячи в игру
    for (int i = 0; i < msg.balls; i++)
      m_players[ (rand() % PLAYERS) ].send(msg_ball());
  }